

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O1

void __thiscall Imaginer::Utils::iRpn::Parser(iRpn *this)

{
  bool bVar1;
  uint uVar2;
  RPNnode *pRVar3;
  undefined1 uVar4;
  char cVar5;
  ulong uVar6;
  double dVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  anon_union_8_2_93b31755_for__node *paVar11;
  char *pcVar12;
  double dVar13;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  RPNnode curnode;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_50;
  anon_union_8_2_93b31755_for__node local_40;
  char local_38;
  
  local_50._size = 0x400;
  local_50._top = 0xffffffff;
  local_50._data = (RPNnode *)operator_new__(0x4000);
  lVar9 = 0;
  do {
    (&(local_50._data)->_is)[lVar9] = false;
    *(undefined8 *)((long)&(local_50._data)->_node + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x4000);
  uVar2 = this->_operands->_top;
  local_38 = '\0';
  local_40._value = 0.0;
  if (-1 < (int)uVar2) {
    lVar9 = 0;
    do {
      pRVar3 = this->_operands->_data;
      if ((anon_union_8_2_93b31755_for__node *)((long)&pRVar3->_node + lVar9) != &local_40) {
        local_40 = *(anon_union_8_2_93b31755_for__node *)((long)&pRVar3->_node + lVar9);
        local_38 = (&pRVar3->_is)[lVar9];
      }
      if (local_38 != '\0') {
        lVar10 = (long)local_50._top;
        local_50._top = (int)(lVar10 + 1);
        paVar11 = &local_50._data[lVar10 + 1]._node;
        if (paVar11 == &local_40) goto LAB_00106a64;
        *paVar11 = local_40;
        cVar5 = local_38;
        goto LAB_0010689f;
      }
      uVar4 = local_40._sign;
      lVar10 = (long)local_40._sign;
      if (((int)local_40._sign - 0x58U & 0xde) == 0) {
        lVar10 = (long)local_50._top;
        local_50._top = (int)(lVar10 + 1);
        paVar11 = &local_50._data[lVar10 + 1]._node;
        if (paVar11 != &local_40) {
          *paVar11 = local_40;
          paVar11[1]._sign = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"unknowns nunber ",0x10);
        poVar8 = operator<<((ostream *)&std::cout,(RPNnode *)&local_40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
LAB_00106a51:
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_00106a64;
      }
      if (local_40._sign < '\0') {
        if (-0x6c < local_40._sign) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"no sunch Function: ",0x13);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Function: ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(lVar10 * 0x20 + 0x10c550),
                            *(long *)(lVar10 * 0x20 + 0x10c558));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      uVar6 = (ulong)(uint)local_50._top;
      if (local_50._top < 1) goto LAB_00106a64;
      lVar10 = 0x12;
      if (local_50._data[uVar6]._is == false) {
        pcVar12 = "L cannot calculate";
switchD_001069a7_caseD_2:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        poVar8 = (ostream *)&std::cout;
        goto LAB_00106a51;
      }
      bVar1 = local_50._data[uVar6 - 1]._is;
      pcVar12 = "R cannot calculate";
      if (bVar1 == false) goto switchD_001069a7_caseD_2;
      dVar7 = local_50._data[uVar6]._node._value;
      dVar13 = local_50._data[uVar6 - 1]._node._value;
      lVar10 = 0x10;
      pcVar12 = "invalid operator";
      switch(uVar4) {
      case 0x2a:
        dVar13 = dVar13 * dVar7;
        break;
      case 0x2b:
        dVar13 = dVar13 + dVar7;
        goto LAB_00106ad7;
      case 0x2c:
      case 0x2e:
        goto switchD_001069a7_caseD_2;
      case 0x2d:
        dVar13 = dVar13 - dVar7;
LAB_00106ad7:
        lVar10 = uVar6 + 1;
        local_50._top = (int)lVar10;
        paVar11 = &local_50._data[lVar10]._node;
        local_50._data[lVar10]._node =
             (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
        goto LAB_00106b25;
      case 0x2f:
        dVar13 = dVar13 / dVar7;
        break;
      default:
        if (uVar4 == '^') {
          dVar7 = pow(dVar13,dVar7);
        }
        else {
          pcVar12 = "invalid operator";
          if (uVar4 != '_') goto switchD_001069a7_caseD_2;
          lVar10 = uVar6 + 1;
          local_50._top = (int)lVar10;
          local_50._data[lVar10]._node._value = dVar13;
          local_50._data[lVar10]._is = bVar1;
          dVar7 = -dVar7;
        }
        lVar10 = (long)local_50._top + 1;
        local_50._top = (int)lVar10;
        paVar11 = &local_50._data[lVar10]._node;
        local_50._data[lVar10]._node =
             (anon_union_8_2_93b31755_for__node)(dVar7 & 0xffffffffffffff00);
        goto LAB_00106b25;
      }
      local_50._top = local_50._top + 1;
      paVar11 = &local_50._data[uVar6 + 1]._node;
      *paVar11 = (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
LAB_00106b25:
      cVar5 = true;
LAB_0010689f:
      paVar11[1]._sign = cVar5;
LAB_00106a64:
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar2 * 0x10 + 0x10 != lVar9);
  }
  poVar8 = operator<<((ostream *)&std::cout,&local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_50._data != (RPNnode *)0x0) {
    operator_delete__(local_50._data);
  }
  return;
}

Assistant:

void iRpn::Parser()
{
    //genRpn();
    //_operands->reverse();
    iStack<RPNnode> result;
    int size = _operands->size();
    RPNnode curnode;
    char op = '\0';
    RPNnode  loperand;
    RPNnode  roperand;
    for(int i = 0;i <= size;++i)
    {
        curnode = (*_operands)[i];
        //std::cout << curnode << "\n";
        if(!curnode)//opearator
        {
            if(isVariable(curnode))
            {
                result.push(curnode);
                std::cout << "unknowns nunber " << curnode << std::endl;
            }
            else
            {
                op = curnode;
                if(op < 0)
                {
                    if(isFun(op))
                        std::cout << "Function: " << _sysfunS[op+128] << std::endl;
                    else
                    {
                        std::cout << "no sunch Function: " << std::endl;
                        break;
                    }
                }
                if(result.empty() || result.size() < 1)
                {
                    continue;
                }
                loperand = result[-1];
                roperand = result[-2];
                if(!loperand)
                {
                    std::cout << "L cannot calculate" << std::endl;
                    continue;
                }
                if(!roperand)
                {
                    std::cout << "R cannot calculate" << std::endl;
                    continue;
                }
                switch (op)
                {
                case '_':
                    result.push(roperand);
                    result.push(-loperand);
                    break;
                case '+':
                    result.push(roperand+loperand);
                    break;
                case '-':
                    result.push(roperand-loperand);
                    break;
                case '*':
                    result.push(roperand*loperand);
                    break;
                case '/':
                    result.push(roperand/loperand);
                    break;
                case '^':
                    result.push(pow(roperand,loperand));
                    break;
                default:
                    std::cout << "invalid operator" << std::endl;
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            //std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
}